

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::analysis::Function::IsSameImpl(Function *this,Type *that,IsSameCache *seen)

{
  value_type pTVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  size_type sVar5;
  size_type sVar6;
  const_reference ppTVar7;
  ulong local_38;
  size_t i;
  Function *ft;
  IsSameCache *seen_local;
  Type *that_local;
  Function *this_local;
  long lVar4;
  
  iVar2 = (*that->_vptr_Type[0x22])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  if (lVar4 == 0) {
    this_local._7_1_ = false;
  }
  else {
    uVar3 = (*this->return_type_->_vptr_Type[2])
                      (this->return_type_,*(undefined8 *)(lVar4 + 0x28),seen);
    if ((uVar3 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      sVar5 = std::
              vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ::size(&this->param_types_);
      sVar6 = std::
              vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ::size((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                      *)(lVar4 + 0x30));
      if (sVar5 == sVar6) {
        for (local_38 = 0;
            sVar5 = std::
                    vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                    ::size(&this->param_types_), local_38 < sVar5; local_38 = local_38 + 1) {
          ppTVar7 = std::
                    vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                    ::operator[](&this->param_types_,local_38);
          pTVar1 = *ppTVar7;
          ppTVar7 = std::
                    vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                    ::operator[]((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                                  *)(lVar4 + 0x30),local_38);
          uVar3 = (*pTVar1->_vptr_Type[2])(pTVar1,*ppTVar7,seen);
          if ((uVar3 & 1) == 0) {
            return false;
          }
        }
        this_local._7_1_ = Type::HasSameDecorations(&this->super_Type,that);
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Function::IsSameImpl(const Type* that, IsSameCache* seen) const {
  const Function* ft = that->AsFunction();
  if (!ft) return false;
  if (!return_type_->IsSameImpl(ft->return_type_, seen)) return false;
  if (param_types_.size() != ft->param_types_.size()) return false;
  for (size_t i = 0; i < param_types_.size(); ++i) {
    if (!param_types_[i]->IsSameImpl(ft->param_types_[i], seen)) return false;
  }
  return HasSameDecorations(that);
}